

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

USTATUS decompress(UByteArray *compressedData,UINT8 compressionType,UINT8 *algorithm,
                  UINT32 *dictionarySize,UByteArray *decompressedData,
                  UByteArray *efiDecompressedData)

{
  uint *Source;
  string *psVar1;
  UINT8 UVar2;
  UINTN UVar3;
  char *pcVar4;
  UINTN UVar5;
  USTATUS UVar6;
  Byte *data;
  ulong uVar7;
  int iVar8;
  undefined7 in_register_00000031;
  UINT32 UVar9;
  pointer pcVar10;
  UINT32 decompressedSize;
  char *local_88;
  UINT32 scratchSize;
  UByteArray local_78;
  string *local_58;
  char *local_50;
  ulong local_48;
  ulong local_40;
  UINT32 state;
  
  decompressedSize = 0;
  scratchSize = 0;
  *dictionarySize = 0;
  iVar8 = (int)CONCAT71(in_register_00000031,compressionType);
  if (iVar8 == 0x86) {
    *algorithm = '\0';
    pcVar10 = (compressedData->d)._M_dataplus._M_p;
    UVar9 = (UINT32)(compressedData->d)._M_string_length;
    UVar6 = LzmaGetInfo(pcVar10,UVar9,&decompressedSize);
    if (UVar6 != 0) {
      return 0x19;
    }
    *algorithm = '\a';
    data = (Byte *)malloc((ulong)decompressedSize);
    if (data == (Byte *)0x0) {
      return 4;
    }
    UVar6 = LzmaDecompress(pcVar10,UVar9,data);
    if ((UVar6 == 0) && (-1 < (long)(int)decompressedSize)) {
      state = 0;
      z7_BranchConvSt_X86_Dec(data,(long)(int)decompressedSize,0,&state);
      *dictionarySize = *(UINT32 *)(pcVar10 + 1);
      UByteArray::UByteArray(&local_78,(char *)data,decompressedSize);
      std::__cxx11::string::_M_assign((string *)decompressedData);
LAB_0012869b:
      std::__cxx11::string::~string((string *)&local_78);
      free(data);
      return 0;
    }
  }
  else {
    if (iVar8 == 1) {
      *algorithm = '\0';
      Source = (uint *)(compressedData->d)._M_dataplus._M_p;
      uVar7 = (compressedData->d)._M_string_length;
      UVar9 = (UINT32)uVar7;
      UVar6 = 0x18;
      if ((ulong)*Source + 8 != (uVar7 & 0xffffffff)) {
        return 0x18;
      }
      UVar3 = EfiTianoGetInfo(Source,UVar9,&decompressedSize,&scratchSize);
      if (UVar3 != 0) {
        return 0x18;
      }
      uVar7 = (ulong)decompressedSize;
      local_58 = (string *)decompressedData;
      local_88 = (char *)malloc(uVar7);
      local_40 = uVar7;
      pcVar4 = (char *)malloc(uVar7);
      local_48 = (ulong)scratchSize;
      data = (Byte *)malloc(local_48);
      local_50 = pcVar4;
      if ((pcVar4 == (char *)0x0 || local_88 == (char *)0x0) || data == (Byte *)0x0) {
        free(local_88);
        free(local_50);
        goto LAB_00128653;
      }
      UVar3 = TianoDecompress(Source,UVar9,local_88,(UINT32)local_40,data,(UINT32)local_48);
      pcVar4 = local_50;
      UVar5 = EfiDecompress(Source,UVar9,local_50,decompressedSize,data,scratchSize);
      psVar1 = local_58;
      UVar6 = 0x18;
      if (-1 < (int)decompressedSize) {
        if (UVar5 == 0 && UVar3 == 0) {
          *algorithm = '\x04';
          UByteArray::UByteArray(&local_78,local_88,decompressedSize);
          std::__cxx11::string::_M_assign(local_58);
          std::__cxx11::string::~string((string *)&local_78);
          UByteArray::UByteArray(&local_78,pcVar4,decompressedSize);
          std::__cxx11::string::_M_assign((string *)efiDecompressedData);
        }
        else if (UVar3 == 0) {
          *algorithm = '\x03';
          UByteArray::UByteArray(&local_78,local_88,decompressedSize);
          std::__cxx11::string::_M_assign(psVar1);
        }
        else {
          if (UVar5 != 0) goto LAB_0012872f;
          *algorithm = '\x02';
          UByteArray::UByteArray(&local_78,pcVar4,decompressedSize);
          std::__cxx11::string::_M_assign(psVar1);
        }
        std::__cxx11::string::~string((string *)&local_78);
        UVar6 = 0;
      }
LAB_0012872f:
      free(local_88);
      free(pcVar4);
      goto LAB_00128653;
    }
    if (iVar8 != 2) {
      if (iVar8 == 0) {
        std::__cxx11::string::_M_assign((string *)decompressedData);
        *algorithm = '\x01';
        return 0;
      }
      *algorithm = '\0';
      return 0x1b;
    }
    *algorithm = '\0';
    pcVar10 = (compressedData->d)._M_dataplus._M_p;
    UVar9 = (UINT32)(compressedData->d)._M_string_length;
    UVar6 = LzmaGetInfo(pcVar10,UVar9,&decompressedSize);
    if (UVar6 == 0) {
      UVar2 = '\x05';
    }
    else {
      pcVar10 = pcVar10 + 4;
      UVar6 = LzmaGetInfo(pcVar10,UVar9,&decompressedSize);
      if (UVar6 != 0) {
        return 0x19;
      }
      UVar2 = '\x06';
    }
    *algorithm = UVar2;
    data = (Byte *)malloc((ulong)decompressedSize);
    if (data == (Byte *)0x0) {
      return 4;
    }
    UVar6 = LzmaDecompress(pcVar10,UVar9,data);
    if ((UVar6 == 0) && (-1 < (int)decompressedSize)) {
      *dictionarySize = *(UINT32 *)(pcVar10 + 1);
      UByteArray::UByteArray(&local_78,(char *)data,decompressedSize);
      std::__cxx11::string::_M_assign((string *)decompressedData);
      goto LAB_0012869b;
    }
  }
  UVar6 = 0x19;
LAB_00128653:
  free(data);
  return UVar6;
}

Assistant:

USTATUS decompress(const UByteArray & compressedData, const UINT8 compressionType, UINT8 & algorithm, UINT32 & dictionarySize, UByteArray & decompressedData, UByteArray & efiDecompressedData)
{
    const UINT8* data;
    UINT32 dataSize;
    UINT8* decompressed;
    UINT8* efiDecompressed;
    UINT32 decompressedSize = 0;
    UINT8* scratch;
    UINT32 scratchSize = 0;
    const EFI_TIANO_HEADER* header;
    
    // For all but LZMA dictionary size is 0
    dictionarySize = 0;
    
    switch (compressionType)
    {
        case EFI_NOT_COMPRESSED: {
            decompressedData = compressedData;
            algorithm = COMPRESSION_ALGORITHM_NONE;
            return U_SUCCESS;
        }
        case EFI_STANDARD_COMPRESSION: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (UINT8*)compressedData.data();
            dataSize = (UINT32)compressedData.size();
            
            // Check header to be valid
            header = (const EFI_TIANO_HEADER*)data;
            if (header->CompSize + sizeof(EFI_TIANO_HEADER) != dataSize)
                return U_STANDARD_DECOMPRESSION_FAILED;
            
            // Get info function is the same for both algorithms
            if (U_SUCCESS != EfiTianoGetInfo(data, dataSize, &decompressedSize, &scratchSize))
                return U_STANDARD_DECOMPRESSION_FAILED;
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            efiDecompressed = (UINT8*)malloc(decompressedSize);
            scratch = (UINT8*)malloc(scratchSize);
            if (!decompressed || !efiDecompressed || !scratch) {
                free(decompressed);
                free(efiDecompressed);
                free(scratch);
                return U_STANDARD_DECOMPRESSION_FAILED;
            }
            
            // Decompress section data using both algorithms
            USTATUS result = U_SUCCESS;
            // Try Tiano
            USTATUS TianoResult = TianoDecompress(data, dataSize, decompressed, decompressedSize, scratch, scratchSize);
            // Try EFI 1.1
            USTATUS EfiResult = EfiDecompress(data, dataSize, efiDecompressed, decompressedSize, scratch, scratchSize);
            
            if (decompressedSize > INT32_MAX) {
                result = U_STANDARD_DECOMPRESSION_FAILED;
            }
            else if (EfiResult == U_SUCCESS && TianoResult == U_SUCCESS) { // Both decompressions are OK
                algorithm = COMPRESSION_ALGORITHM_UNDECIDED;
                decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
                efiDecompressedData = UByteArray((const char*)efiDecompressed, (int)decompressedSize);
            }
            else if (TianoResult == U_SUCCESS) { // Only Tiano is OK
                algorithm = COMPRESSION_ALGORITHM_TIANO;
                decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            }
            else if (EfiResult == U_SUCCESS) { // Only EFI 1.1 is OK
                algorithm = COMPRESSION_ALGORITHM_EFI11;
                decompressedData = UByteArray((const char*)efiDecompressed, (int)decompressedSize);
            }
            else { // Both decompressions failed
                result = U_STANDARD_DECOMPRESSION_FAILED;
            }
            
            free(decompressed);
            free(efiDecompressed);
            free(scratch);
            return result;
        }
        case EFI_CUSTOMIZED_COMPRESSION: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (const UINT8*)compressedData.constData();
            dataSize = (UINT32)compressedData.size();
            
            // Get info as normal LZMA section
            if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                // Get info as Intel legacy LZMA section
                data += sizeof(UINT32);
                if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                    return U_CUSTOMIZED_DECOMPRESSION_FAILED;
                }
                else {
                    algorithm = COMPRESSION_ALGORITHM_LZMA_INTEL_LEGACY;
                }
            }
            else {
                algorithm = COMPRESSION_ALGORITHM_LZMA;
            }
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            if (!decompressed) {
                return U_OUT_OF_MEMORY;
            }
            
            // Decompress section data
            if (U_SUCCESS != LzmaDecompress(data, dataSize, decompressed)) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            if (decompressedSize > INT32_MAX) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            dictionarySize = readUnaligned((UINT32*)(data + 1)); // LZMA dictionary size is stored in bytes 1-4 of LZMA properties header
            decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            free(decompressed);
            return U_SUCCESS;
        }
        case EFI_CUSTOMIZED_COMPRESSION_LZMAF86: {
            // Set default algorithm to unknown
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            
            // Get buffer sizes
            data = (const UINT8*)compressedData.constData();
            dataSize = (UINT32)compressedData.size();
            
            // Get info as normal LZMA section
            if (U_SUCCESS != LzmaGetInfo(data, dataSize, &decompressedSize)) {
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            algorithm = COMPRESSION_ALGORITHM_LZMAF86;
            
            // Allocate memory
            decompressed = (UINT8*)malloc(decompressedSize);
            if (!decompressed) {
                return U_OUT_OF_MEMORY;
            }
            
            // Decompress section data
            if (U_SUCCESS != LzmaDecompress(data, dataSize, decompressed)) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            if (decompressedSize > INT32_MAX) {
                free(decompressed);
                return U_CUSTOMIZED_DECOMPRESSION_FAILED;
            }
            
            // TODO: need to correctly handle non-x86 architecture of the FW image
            // After LZMA decompression, the data need to be converted to the raw data.
            UINT32 state = 0;
            z7_BranchConvSt_X86_Dec(decompressed, decompressedSize, 0, &state);
            
            dictionarySize = readUnaligned((UINT32*)(data + 1)); // LZMA dictionary size is stored in bytes 1-4 of LZMA properties header
            decompressedData = UByteArray((const char*)decompressed, (int)decompressedSize);
            free(decompressed);
            return U_SUCCESS;
        }
        default: {
            algorithm = COMPRESSION_ALGORITHM_UNKNOWN;
            return U_UNKNOWN_COMPRESSION_TYPE;
        }
    }
}